

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

string * ovf::detail::write::top_header_string_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDI;
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)in_RDI,"# OOMMF OVF 2.0\n",(allocator *)&padding);
  std::__cxx11::string::append((string *)in_RDI);
  padding._M_dataplus._M_p = (pointer)&padding.field_2;
  std::__cxx11::string::_M_construct((ulong)&padding,'\x06');
  fmt::v5::format<char[21],std::__cxx11::string>
            (&local_30,(v5 *)"# Segment count: {}\n",(char (*) [21])&padding,in_RCX);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&padding);
  return in_RDI;
}

Assistant:

inline std::string top_header_string()
    {
        std::string ret = "# OOMMF OVF 2.0\n";
        ret += empty_line;

        // create padding string
        std::string padding( n_segments_str_digits, '0' );
        // write padding plus n_segments
        ret += fmt::format( "# Segment count: {}\n", padding );

        return ret;
    }